

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturecache.cpp
# Opt level: O1

void __thiscall
QOpenGLTextureCache::QOpenGLTextureCache(QOpenGLTextureCache *this,QOpenGLContext *ctx)

{
  int iVar1;
  QOpenGLContextGroup *pQVar2;
  undefined8 *puVar3;
  size_t sVar4;
  long lVar5;
  long in_FS_OFFSET;
  bool ok;
  bool local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QOpenGLContextGroup *)QOpenGLContext::shareGroup();
  QOpenGLSharedResource::QOpenGLSharedResource(&this->super_QOpenGLSharedResource,pQVar2);
  *(undefined ***)this = &PTR__QOpenGLTextureCache_001a2450;
  (this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  local_29 = false;
  iVar1 = qEnvironmentVariableIntValue("QT_OPENGL_TEXTURE_CACHE_SIZE",&local_29);
  lVar5 = 0x100000;
  if (local_29 != false) {
    lVar5 = (long)iVar1;
  }
  (this->m_cache).chain.prev = &(this->m_cache).chain;
  (this->m_cache).chain.next = &(this->m_cache).chain;
  (this->m_cache).d.ref.atomic._q_value.super___atomic_base<int>._M_i = 1;
  (this->m_cache).d.size = 0;
  (this->m_cache).d.numBuckets = 0;
  (this->m_cache).d.seed = 0;
  (this->m_cache).d.spans = (Span *)0x0;
  (this->m_cache).d.numBuckets = 0x80;
  puVar3 = (undefined8 *)operator_new__(0x98);
  *puVar3 = 1;
  puVar3[0x11] = 0;
  *(undefined2 *)(puVar3 + 0x12) = 0;
  *(undefined4 *)(puVar3 + 1) = 0xffffffff;
  *(undefined4 *)((long)puVar3 + 0xc) = 0xffffffff;
  *(undefined4 *)(puVar3 + 2) = 0xffffffff;
  *(undefined4 *)((long)puVar3 + 0x14) = 0xffffffff;
  *(undefined4 *)(puVar3 + 3) = 0xffffffff;
  *(undefined4 *)((long)puVar3 + 0x1c) = 0xffffffff;
  *(undefined4 *)(puVar3 + 4) = 0xffffffff;
  *(undefined4 *)((long)puVar3 + 0x24) = 0xffffffff;
  *(undefined4 *)(puVar3 + 5) = 0xffffffff;
  *(undefined4 *)((long)puVar3 + 0x2c) = 0xffffffff;
  *(undefined4 *)(puVar3 + 6) = 0xffffffff;
  *(undefined4 *)((long)puVar3 + 0x34) = 0xffffffff;
  *(undefined4 *)(puVar3 + 7) = 0xffffffff;
  *(undefined4 *)((long)puVar3 + 0x3c) = 0xffffffff;
  *(undefined4 *)(puVar3 + 8) = 0xffffffff;
  *(undefined4 *)((long)puVar3 + 0x44) = 0xffffffff;
  *(undefined4 *)(puVar3 + 9) = 0xffffffff;
  *(undefined4 *)((long)puVar3 + 0x4c) = 0xffffffff;
  *(undefined4 *)(puVar3 + 10) = 0xffffffff;
  *(undefined4 *)((long)puVar3 + 0x54) = 0xffffffff;
  *(undefined4 *)(puVar3 + 0xb) = 0xffffffff;
  *(undefined4 *)((long)puVar3 + 0x5c) = 0xffffffff;
  *(undefined4 *)(puVar3 + 0xc) = 0xffffffff;
  *(undefined4 *)((long)puVar3 + 100) = 0xffffffff;
  *(undefined4 *)(puVar3 + 0xd) = 0xffffffff;
  *(undefined4 *)((long)puVar3 + 0x6c) = 0xffffffff;
  *(undefined4 *)(puVar3 + 0xe) = 0xffffffff;
  *(undefined4 *)((long)puVar3 + 0x74) = 0xffffffff;
  *(undefined4 *)(puVar3 + 0xf) = 0xffffffff;
  *(undefined4 *)((long)puVar3 + 0x7c) = 0xffffffff;
  *(undefined4 *)(puVar3 + 0x10) = 0xffffffff;
  *(undefined4 *)((long)puVar3 + 0x84) = 0xffffffff;
  (this->m_cache).d.spans = (Span *)(puVar3 + 1);
  sVar4 = QHashSeed::globalSeed();
  (this->m_cache).d.seed = sVar4;
  (this->m_cache).mx = lVar5;
  (this->m_cache).total = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QOpenGLTextureCache::QOpenGLTextureCache(QOpenGLContext *ctx)
    : QOpenGLSharedResource(ctx->shareGroup())
    , m_cache(cacheSize())
{
}